

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_pos_bucket_kv::set_input(llm_graph_input_pos_bucket_kv *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  int32_t iVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  int32_t *piVar8;
  long lVar9;
  int32_t *local_48;
  
  if (this->pos_bucket == (ggml_tensor *)0x0) {
    return;
  }
  uVar1 = ubatch->n_tokens;
  cVar3 = ggml_backend_buffer_is_host(this->pos_bucket->buffer);
  if (cVar3 == '\0') {
    pcVar5 = "ggml_backend_buffer_is_host(pos_bucket->buffer)";
    uVar7 = 0x65;
  }
  else {
    if (ubatch->equal_seqs != true) {
      if ((ulong)uVar1 == 0) {
        return;
      }
      local_48 = (int32_t *)this->pos_bucket->data;
      uVar2 = this->kv_self->n;
      uVar6 = 0;
      do {
        if (uVar2 != 0) {
          lVar9 = 0;
          piVar8 = local_48;
          do {
            iVar4 = llama_relative_position_bucket
                              (*(llama_pos *)
                                ((long)&((this->kv_self->cells).
                                         super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->pos + lVar9),
                               ubatch->pos[uVar6],(ulong)this->hparams->n_rel_attn_bkts,false);
            *piVar8 = iVar4;
            piVar8 = piVar8 + 1;
            lVar9 = lVar9 + 0x40;
          } while ((ulong)uVar2 << 6 != lVar9);
        }
        uVar6 = uVar6 + 1;
        local_48 = local_48 + uVar2;
      } while (uVar6 != uVar1);
      return;
    }
    pcVar5 = "!ubatch->equal_seqs";
    uVar7 = 0x66;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar7,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

void llm_graph_input_pos_bucket_kv::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        const int64_t n_kv = kv_self->n;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_kv; ++i) {
                    data[h*(n_kv*n_tokens) + j*n_kv + i] = llama_relative_position_bucket(kv_self->cells[i].pos, ubatch->pos[j], hparams.n_rel_attn_bkts, false);
                }
            }
        }
    }
}